

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O3

bool __thiscall
BamTools::BamAlignment::SkipToNextTag
          (BamAlignment *this,char storageType,char **pTagData,uint *numBytesParsed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte __rhs;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  size_type *psVar7;
  undefined7 in_register_00000031;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  string message;
  string local_58;
  string local_38;
  ulong uVar11;
  
  iVar9 = (int)CONCAT71(in_register_00000031,storageType);
  if (iVar9 < 0x53) {
    switch(iVar9) {
    case 0x41:
    case 0x43:
switchD_0019f216_caseD_41:
      *numBytesParsed = *numBytesParsed + 1;
      *pTagData = *pTagData + 1;
      break;
    case 0x42:
      pbVar3 = (byte *)*pTagData;
      __rhs = *pbVar3;
      uVar5 = *numBytesParsed;
      *numBytesParsed = uVar5 + 1;
      *pTagData = (char *)(pbVar3 + 1);
      iVar9 = *(int *)(pbVar3 + 1);
      uVar5 = uVar5 + 5;
      *numBytesParsed = uVar5;
      *pTagData = (char *)(pbVar3 + 5);
      uVar10 = __rhs - 0x43;
      uVar11 = (ulong)uVar10;
      if (uVar10 < 0x31) {
        if ((0x4800000040U >> (uVar11 & 0x3f) & 1) == 0) {
          if ((0x100000001U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x1000000010000U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_0019f3e0;
            iVar9 = iVar9 * 2;
          }
        }
        else {
          iVar9 = iVar9 << 2;
        }
        *numBytesParsed = uVar5 + iVar9;
        *pTagData = (char *)(pbVar3 + 5 + iVar9);
        break;
      }
LAB_0019f3e0:
      paVar1 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid binary array type: ","");
      std::operator+(&local_38,&local_58,__rhs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"BamAlignment::SkipToNextTag","");
      SetErrorString(this,&local_58,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) goto LAB_0019f3d4;
      goto LAB_0019f3d9;
    default:
      goto switchD_0019f216_caseD_44;
    case 0x48:
switchD_0019f216_caseD_48:
      pcVar8 = *pTagData;
      uVar5 = *numBytesParsed;
      cVar2 = *pcVar8;
      while (cVar2 != '\0') {
        pcVar8 = pcVar8 + 1;
        uVar5 = uVar5 + 1;
        *numBytesParsed = uVar5;
        *pTagData = pcVar8;
        cVar2 = *pcVar8;
      }
      *numBytesParsed = uVar5 + 1;
      *pTagData = pcVar8 + 1;
      break;
    case 0x49:
switchD_0019f216_caseD_49:
      *numBytesParsed = *numBytesParsed + 4;
      *pTagData = *pTagData + 4;
    }
LAB_0019f35a:
    bVar4 = true;
  }
  else {
    if (iVar9 < 0x66) {
      if (iVar9 == 0x53) {
LAB_0019f238:
        *numBytesParsed = *numBytesParsed + 2;
        *pTagData = *pTagData + 2;
        goto LAB_0019f35a;
      }
      if (iVar9 == 0x5a) goto switchD_0019f216_caseD_48;
      if (iVar9 == 99) goto switchD_0019f216_caseD_41;
    }
    else {
      if ((iVar9 == 0x66) || (iVar9 == 0x69)) goto switchD_0019f216_caseD_49;
      if (iVar9 == 0x73) goto LAB_0019f238;
    }
switchD_0019f216_caseD_44:
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"invalid tag type: ","");
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_58,local_58._M_string_length,0,'\x01');
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_38.field_2._M_allocated_capacity = *psVar7;
      local_38.field_2._8_8_ = plVar6[3];
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    }
    else {
      local_38.field_2._M_allocated_capacity = *psVar7;
      local_38._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_38._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"BamAlignment::SkipToNextTag","");
    SetErrorString(this,&local_58,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
LAB_0019f3d4:
      operator_delete(local_38._M_dataplus._M_p);
    }
LAB_0019f3d9:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BamAlignment::SkipToNextTag(const char storageType, char*& pTagData,
                                 unsigned int& numBytesParsed) const
{
    switch (storageType) {

        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            numBytesParsed += sizeof(uint16_t);
            pTagData += sizeof(uint16_t);
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);
            break;

        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
            while (*pTagData) {
                ++numBytesParsed;
                ++pTagData;
            }
            // increment for null-terminator
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_ARRAY):

        {
            // read array type
            const char arrayType = *pTagData;
            ++numBytesParsed;
            ++pTagData;

            // read number of elements
            int32_t numElements;
            memcpy(&numElements, pTagData, sizeof(uint32_t));  // already endian-swapped, if needed
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);

            // calculate number of bytes to skip
            int bytesToSkip = 0;
            switch (arrayType) {
                case (Constants::BAM_TAG_TYPE_INT8):
                case (Constants::BAM_TAG_TYPE_UINT8):
                    bytesToSkip = numElements;
                    break;
                case (Constants::BAM_TAG_TYPE_INT16):
                case (Constants::BAM_TAG_TYPE_UINT16):
                    bytesToSkip = numElements * sizeof(uint16_t);
                    break;
                case (Constants::BAM_TAG_TYPE_FLOAT):
                case (Constants::BAM_TAG_TYPE_INT32):
                case (Constants::BAM_TAG_TYPE_UINT32):
                    bytesToSkip = numElements * sizeof(uint32_t);
                    break;
                default:
                    const std::string message =
                        std::string("invalid binary array type: ") + arrayType;
                    SetErrorString("BamAlignment::SkipToNextTag", message);
                    return false;
            }

            // skip binary array contents
            numBytesParsed += bytesToSkip;
            pTagData += bytesToSkip;
            break;
        }

        default:
            const std::string message = std::string("invalid tag type: ") + storageType;
            SetErrorString("BamAlignment::SkipToNextTag", message);
            return false;
    }

    // if we get here, tag skipped OK - return success
    return true;
}